

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

int google::protobuf::io::CodedOutputStream::VarintSize64(uint64 value)

{
  uint64 value_local;
  
  if (value < 0x800000000) {
    if (value < 0x80) {
      value_local._4_4_ = 1;
    }
    else if (value < 0x4000) {
      value_local._4_4_ = 2;
    }
    else if (value < 0x200000) {
      value_local._4_4_ = 3;
    }
    else if (value < 0x10000000) {
      value_local._4_4_ = 4;
    }
    else {
      value_local._4_4_ = 5;
    }
  }
  else if (value < 0x40000000000) {
    value_local._4_4_ = 6;
  }
  else if (value < 0x2000000000000) {
    value_local._4_4_ = 7;
  }
  else if (value < 0x100000000000000) {
    value_local._4_4_ = 8;
  }
  else if (value < 0x8000000000000000) {
    value_local._4_4_ = 9;
  }
  else {
    value_local._4_4_ = 10;
  }
  return value_local._4_4_;
}

Assistant:

int CodedOutputStream::VarintSize64(uint64 value) {
  if (value < (1ull << 35)) {
    if (value < (1ull << 7)) {
      return 1;
    } else if (value < (1ull << 14)) {
      return 2;
    } else if (value < (1ull << 21)) {
      return 3;
    } else if (value < (1ull << 28)) {
      return 4;
    } else {
      return 5;
    }
  } else {
    if (value < (1ull << 42)) {
      return 6;
    } else if (value < (1ull << 49)) {
      return 7;
    } else if (value < (1ull << 56)) {
      return 8;
    } else if (value < (1ull << 63)) {
      return 9;
    } else {
      return 10;
    }
  }
}